

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utf8SourceInfo.cpp
# Opt level: O2

void __thiscall
Js::Utf8SourceInfo::RemoveFunctionBody(Utf8SourceInfo *this,FunctionBody *functionBody)

{
  code *pcVar1;
  bool bVar2;
  LocalFunctionId LVar3;
  undefined8 in_RAX;
  undefined4 *puVar4;
  FunctionBody *pFVar5;
  undefined8 uStack_28;
  LocalFunctionId functionId;
  
  uStack_28 = in_RAX;
  if ((this->functionBodyDictionary).ptr ==
      (SynchronizedDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_Js::DefaultContainerLockPolicy,_CriticalSection>
       *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/Utf8SourceInfo.cpp"
                                ,0x72,"(this->functionBodyDictionary)",
                                "this->functionBodyDictionary");
    if (!bVar2) goto LAB_00729142;
    *puVar4 = 0;
  }
  LVar3 = FunctionProxy::GetLocalFunctionId((FunctionProxy *)functionBody);
  uStack_28 = CONCAT44(LVar3,(undefined4)uStack_28);
  pFVar5 = JsUtil::
           BaseDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
           ::Item(&((this->functionBodyDictionary).ptr)->
                   super_BaseDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                  ,(uint *)((long)&uStack_28 + 4));
  if (pFVar5 != functionBody) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/Utf8SourceInfo.cpp"
                                ,0x75,"(functionBodyDictionary->Item(functionId) == functionBody)",
                                "functionBodyDictionary->Item(functionId) == functionBody");
    if (!bVar2) {
LAB_00729142:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  JsUtil::
  BaseDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::Remove(&((this->functionBodyDictionary).ptr)->
            super_BaseDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
           ,(uint *)((long)&uStack_28 + 4));
  functionBody->field_0x178 = functionBody->field_0x178 & 0xf7;
  return;
}

Assistant:

void Utf8SourceInfo::RemoveFunctionBody(FunctionBody* functionBody)
    {
        Assert(this->functionBodyDictionary);

        const LocalFunctionId functionId = functionBody->GetLocalFunctionId();
        Assert(functionBodyDictionary->Item(functionId) == functionBody);

        functionBodyDictionary->Remove(functionId);
        functionBody->SetIsFuncRegistered(false);
    }